

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O3

int run_test_pipe_bind_error_addrinuse(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  undefined1 *__s;
  code *unaff_RBX;
  long *plVar3;
  code **ppcVar4;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_pipe_t server2;
  uv_pipe_t server1;
  code *pcStack_1288;
  long lStack_1280;
  long lStack_1278;
  long alStack_1270 [13];
  undefined1 auStack_1208 [232];
  long alStack_1120 [64];
  code *pcStack_f20;
  long lStack_f10;
  long lStack_f08;
  undefined1 auStack_f00 [232];
  code *pcStack_e18;
  long lStack_e08;
  long lStack_e00;
  undefined1 auStack_df8 [232];
  undefined1 auStack_d10 [2047];
  undefined1 uStack_511;
  code *pcStack_510;
  long lStack_500;
  long lStack_4f8;
  undefined1 auStack_4f0 [232];
  code *pcStack_408;
  long lStack_3f8;
  long lStack_3f0;
  undefined1 auStack_3e8 [232];
  code *pcStack_300;
  long lStack_2f0;
  long lStack_2e8;
  undefined1 auStack_2e0 [232];
  code *pcStack_1f8;
  code *pcStack_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8 [29];
  undefined1 local_f0 [232];
  
  pcStack_1f0 = (code *)0x1afef5;
  uVar2 = uv_default_loop();
  pcStack_1f0 = (code *)0x1aff07;
  iVar1 = uv_pipe_init(uVar2,local_f0,0);
  local_1d8[0] = (long)iVar1;
  local_1e8 = 0;
  if (local_1d8[0] == 0) {
    pcStack_1f0 = (code *)0x1aff39;
    iVar1 = uv_pipe_bind(local_f0,"/tmp/uv-test-sock");
    local_1d8[0] = (long)iVar1;
    local_1e8 = 0;
    if (local_1d8[0] != 0) goto LAB_001b00d6;
    pcStack_1f0 = (code *)0x1aff5c;
    uVar2 = uv_default_loop();
    pcStack_1f0 = (code *)0x1aff6b;
    iVar1 = uv_pipe_init(uVar2,local_1d8,0);
    local_1e8 = (long)iVar1;
    local_1e0 = 0;
    if (local_1e8 != 0) goto LAB_001b00e3;
    pcStack_1f0 = (code *)0x1aff9a;
    iVar1 = uv_pipe_bind(local_1d8,"/tmp/uv-test-sock");
    local_1e8 = (long)iVar1;
    local_1e0 = -0x62;
    if (local_1e8 != -0x62) goto LAB_001b00f0;
    pcStack_1f0 = (code *)0x1affcc;
    iVar1 = uv_listen(local_f0,0x1000,0);
    local_1e8 = (long)iVar1;
    local_1e0 = 0;
    if (local_1e8 != 0) goto LAB_001b00fd;
    pcStack_1f0 = (code *)0x1afffb;
    iVar1 = uv_listen(local_1d8,0x1000,0);
    local_1e8 = (long)iVar1;
    local_1e0 = -0x16;
    if (local_1e8 != -0x16) goto LAB_001b010a;
    unaff_RBX = close_cb;
    pcStack_1f0 = (code *)0x1b0030;
    uv_close(local_f0,close_cb);
    pcStack_1f0 = (code *)0x1b003d;
    uv_close(local_1d8,close_cb);
    pcStack_1f0 = (code *)0x1b0042;
    uVar2 = uv_default_loop();
    pcStack_1f0 = (code *)0x1b004c;
    uv_run(uVar2,0);
    local_1e8 = 2;
    local_1e0 = (long)close_cb_called;
    if (local_1e0 != 2) goto LAB_001b0117;
    pcStack_1f0 = (code *)0x1b0074;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_1f0 = (code *)0x1b0088;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_1f0 = (code *)0x1b0092;
    uv_run(unaff_RBX,0);
    local_1e8 = 0;
    pcStack_1f0 = (code *)0x1b009f;
    uVar2 = uv_default_loop();
    pcStack_1f0 = (code *)0x1b00a7;
    iVar1 = uv_loop_close(uVar2);
    local_1e0 = (long)iVar1;
    if (local_1e8 == local_1e0) {
      pcStack_1f0 = (code *)0x1b00be;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1f0 = (code *)0x1b00d6;
    run_test_pipe_bind_error_addrinuse_cold_1();
LAB_001b00d6:
    pcStack_1f0 = (code *)0x1b00e3;
    run_test_pipe_bind_error_addrinuse_cold_2();
LAB_001b00e3:
    pcStack_1f0 = (code *)0x1b00f0;
    run_test_pipe_bind_error_addrinuse_cold_3();
LAB_001b00f0:
    pcStack_1f0 = (code *)0x1b00fd;
    run_test_pipe_bind_error_addrinuse_cold_4();
LAB_001b00fd:
    pcStack_1f0 = (code *)0x1b010a;
    run_test_pipe_bind_error_addrinuse_cold_5();
LAB_001b010a:
    pcStack_1f0 = (code *)0x1b0117;
    run_test_pipe_bind_error_addrinuse_cold_6();
LAB_001b0117:
    pcStack_1f0 = (code *)0x1b0124;
    run_test_pipe_bind_error_addrinuse_cold_7();
  }
  plVar3 = &local_1e8;
  pcStack_1f0 = close_cb;
  run_test_pipe_bind_error_addrinuse_cold_8();
  if (plVar3 != (long *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  pcStack_1f8 = run_test_pipe_bind_error_addrnotavail;
  close_cb_cold_1();
  pcStack_300 = (code *)0x1b0150;
  pcStack_1f8 = unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_300 = (code *)0x1b015f;
  iVar1 = uv_pipe_init(uVar2,auStack_2e0,0);
  lStack_2e8 = (long)iVar1;
  lStack_2f0 = 0;
  if (lStack_2e8 == 0) {
    pcStack_300 = (code *)0x1b0190;
    iVar1 = uv_pipe_bind(auStack_2e0,"/path/to/unix/socket/that/really/should/not/be/there");
    lStack_2e8 = (long)iVar1;
    lStack_2f0 = -0xd;
    if (lStack_2e8 != -0xd) goto LAB_001b025c;
    pcStack_300 = (code *)0x1b01c1;
    uv_close(auStack_2e0,close_cb);
    pcStack_300 = (code *)0x1b01c6;
    uVar2 = uv_default_loop();
    pcStack_300 = (code *)0x1b01d0;
    uv_run(uVar2,0);
    lStack_2e8 = 1;
    lStack_2f0 = (long)close_cb_called;
    if (lStack_2f0 != 1) goto LAB_001b026b;
    pcStack_300 = (code *)0x1b01f6;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_300 = (code *)0x1b020a;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_300 = (code *)0x1b0214;
    uv_run(unaff_RBX,0);
    lStack_2e8 = 0;
    pcStack_300 = (code *)0x1b0222;
    uVar2 = uv_default_loop();
    pcStack_300 = (code *)0x1b022a;
    iVar1 = uv_loop_close(uVar2);
    lStack_2f0 = (long)iVar1;
    if (lStack_2e8 == lStack_2f0) {
      pcStack_300 = (code *)0x1b0242;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_300 = (code *)0x1b025c;
    run_test_pipe_bind_error_addrnotavail_cold_1();
LAB_001b025c:
    pcStack_300 = (code *)0x1b026b;
    run_test_pipe_bind_error_addrnotavail_cold_2();
LAB_001b026b:
    pcStack_300 = (code *)0x1b027a;
    run_test_pipe_bind_error_addrnotavail_cold_3();
  }
  pcStack_300 = run_test_pipe_bind_error_inval;
  run_test_pipe_bind_error_addrnotavail_cold_4();
  pcStack_408 = (code *)0x1b0296;
  pcStack_300 = unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_408 = (code *)0x1b02a5;
  iVar1 = uv_pipe_init(uVar2,auStack_3e8,0);
  lStack_3f0 = (long)iVar1;
  lStack_3f8 = 0;
  if (lStack_3f0 == 0) {
    pcStack_408 = (code *)0x1b02d6;
    iVar1 = uv_pipe_bind(auStack_3e8,"/tmp/uv-test-sock");
    lStack_3f0 = (long)iVar1;
    lStack_3f8 = 0;
    if (lStack_3f0 != 0) goto LAB_001b03d7;
    pcStack_408 = (code *)0x1b0307;
    iVar1 = uv_pipe_bind(auStack_3e8,"/tmp/uv-test-sock2");
    lStack_3f0 = (long)iVar1;
    lStack_3f8 = -0x16;
    if (lStack_3f0 != -0x16) goto LAB_001b03e6;
    pcStack_408 = (code *)0x1b0338;
    uv_close(auStack_3e8,close_cb);
    pcStack_408 = (code *)0x1b033d;
    uVar2 = uv_default_loop();
    pcStack_408 = (code *)0x1b0347;
    uv_run(uVar2,0);
    lStack_3f0 = 1;
    lStack_3f8 = (long)close_cb_called;
    if (lStack_3f8 != 1) goto LAB_001b03f5;
    pcStack_408 = (code *)0x1b0371;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_408 = (code *)0x1b0385;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_408 = (code *)0x1b038f;
    uv_run(unaff_RBX,0);
    lStack_3f0 = 0;
    pcStack_408 = (code *)0x1b039d;
    uVar2 = uv_default_loop();
    pcStack_408 = (code *)0x1b03a5;
    iVar1 = uv_loop_close(uVar2);
    lStack_3f8 = (long)iVar1;
    if (lStack_3f0 == lStack_3f8) {
      pcStack_408 = (code *)0x1b03bd;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_408 = (code *)0x1b03d7;
    run_test_pipe_bind_error_inval_cold_1();
LAB_001b03d7:
    pcStack_408 = (code *)0x1b03e6;
    run_test_pipe_bind_error_inval_cold_2();
LAB_001b03e6:
    pcStack_408 = (code *)0x1b03f5;
    run_test_pipe_bind_error_inval_cold_3();
LAB_001b03f5:
    pcStack_408 = (code *)0x1b0404;
    run_test_pipe_bind_error_inval_cold_4();
  }
  pcStack_408 = run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  pcStack_510 = (code *)0x1b0420;
  pcStack_408 = unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_510 = (code *)0x1b042f;
  iVar1 = uv_pipe_init(uVar2,auStack_4f0,0);
  lStack_4f8 = (long)iVar1;
  lStack_500 = 0;
  if (lStack_4f8 == 0) {
    pcStack_510 = (code *)0x1b0460;
    iVar1 = uv_listen(auStack_4f0,0x1000,0);
    lStack_4f8 = (long)iVar1;
    lStack_500 = -0x16;
    if (lStack_4f8 != -0x16) goto LAB_001b052c;
    pcStack_510 = (code *)0x1b0491;
    uv_close(auStack_4f0,close_cb);
    pcStack_510 = (code *)0x1b0496;
    uVar2 = uv_default_loop();
    pcStack_510 = (code *)0x1b04a0;
    uv_run(uVar2,0);
    lStack_4f8 = 1;
    lStack_500 = (long)close_cb_called;
    if (lStack_500 != 1) goto LAB_001b053b;
    pcStack_510 = (code *)0x1b04c6;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_510 = (code *)0x1b04da;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_510 = (code *)0x1b04e4;
    uv_run(unaff_RBX,0);
    lStack_4f8 = 0;
    pcStack_510 = (code *)0x1b04f2;
    uVar2 = uv_default_loop();
    pcStack_510 = (code *)0x1b04fa;
    iVar1 = uv_loop_close(uVar2);
    lStack_500 = (long)iVar1;
    if (lStack_4f8 == lStack_500) {
      pcStack_510 = (code *)0x1b0512;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_510 = (code *)0x1b052c;
    run_test_pipe_listen_without_bind_cold_1();
LAB_001b052c:
    pcStack_510 = (code *)0x1b053b;
    run_test_pipe_listen_without_bind_cold_2();
LAB_001b053b:
    pcStack_510 = (code *)0x1b054a;
    run_test_pipe_listen_without_bind_cold_3();
  }
  pcStack_510 = run_test_pipe_bind_error_long_path;
  run_test_pipe_listen_without_bind_cold_4();
  __s = auStack_d10;
  pcStack_e18 = (code *)0x1b057b;
  pcStack_510 = unaff_RBX;
  memset(__s,0x2e,0x7ff);
  uStack_511 = 0;
  pcStack_e18 = (code *)0x1b0587;
  uVar2 = uv_default_loop();
  pcStack_e18 = (code *)0x1b0596;
  iVar1 = uv_pipe_init(uVar2,auStack_df8,0);
  if (iVar1 == 0) {
    pcStack_e18 = (code *)0x1b05b0;
    iVar1 = uv_pipe_bind(auStack_df8,auStack_d10);
    if (iVar1 != -0x24) goto LAB_001b0643;
    pcStack_e18 = (code *)0x1b05ca;
    uv_close(auStack_df8,close_cb);
    pcStack_e18 = (code *)0x1b05cf;
    uVar2 = uv_default_loop();
    pcStack_e18 = (code *)0x1b05d9;
    uv_run(uVar2,0);
    if (close_cb_called != 1) goto LAB_001b0648;
    pcStack_e18 = (code *)0x1b05e7;
    __s = (undefined1 *)uv_default_loop();
    pcStack_e18 = (code *)0x1b05fb;
    uv_walk(__s,close_walk_cb,0);
    pcStack_e18 = (code *)0x1b0605;
    uv_run(__s,0);
    lStack_e00 = 0;
    pcStack_e18 = (code *)0x1b0613;
    uVar2 = uv_default_loop();
    pcStack_e18 = (code *)0x1b061b;
    iVar1 = uv_loop_close(uVar2);
    lStack_e08 = (long)iVar1;
    if (lStack_e00 == lStack_e08) {
      pcStack_e18 = (code *)0x1b0633;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_e18 = (code *)0x1b0643;
    run_test_pipe_bind_error_long_path_cold_1();
LAB_001b0643:
    pcStack_e18 = (code *)0x1b0648;
    run_test_pipe_bind_error_long_path_cold_2();
LAB_001b0648:
    pcStack_e18 = (code *)0x1b064d;
    run_test_pipe_bind_error_long_path_cold_3();
  }
  pcStack_e18 = run_test_pipe_bind_or_listen_error_after_close;
  run_test_pipe_bind_error_long_path_cold_4();
  pcStack_f20 = (code *)0x1b0669;
  pcStack_e18 = (code *)__s;
  uVar2 = uv_default_loop();
  pcStack_f20 = (code *)0x1b0678;
  iVar1 = uv_pipe_init(uVar2,auStack_f00,0);
  lStack_f08 = (long)iVar1;
  lStack_f10 = 0;
  if (lStack_f08 == 0) {
    __s = auStack_f00;
    pcStack_f20 = (code *)0x1b06a7;
    uv_close(__s,0);
    pcStack_f20 = (code *)0x1b06b6;
    iVar1 = uv_pipe_bind(__s,"/tmp/uv-test-sock");
    lStack_f08 = (long)iVar1;
    lStack_f10 = -0x16;
    if (lStack_f08 != -0x16) goto LAB_001b07a1;
    pcStack_f20 = (code *)0x1b06e7;
    iVar1 = uv_listen(auStack_f00,0x1000,0);
    lStack_f08 = (long)iVar1;
    lStack_f10 = -0x16;
    if (lStack_f08 != -0x16) goto LAB_001b07b0;
    pcStack_f20 = (code *)0x1b070c;
    uVar2 = uv_default_loop();
    pcStack_f20 = (code *)0x1b0716;
    iVar1 = uv_run(uVar2,0);
    lStack_f08 = (long)iVar1;
    lStack_f10 = 0;
    if (lStack_f08 != 0) goto LAB_001b07bf;
    pcStack_f20 = (code *)0x1b073b;
    __s = (undefined1 *)uv_default_loop();
    pcStack_f20 = (code *)0x1b074f;
    uv_walk(__s,close_walk_cb,0);
    pcStack_f20 = (code *)0x1b0759;
    uv_run(__s,0);
    lStack_f08 = 0;
    pcStack_f20 = (code *)0x1b0767;
    uVar2 = uv_default_loop();
    pcStack_f20 = (code *)0x1b076f;
    iVar1 = uv_loop_close(uVar2);
    lStack_f10 = (long)iVar1;
    if (lStack_f08 == lStack_f10) {
      pcStack_f20 = (code *)0x1b0787;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_f20 = (code *)0x1b07a1;
    run_test_pipe_bind_or_listen_error_after_close_cold_1();
LAB_001b07a1:
    pcStack_f20 = (code *)0x1b07b0;
    run_test_pipe_bind_or_listen_error_after_close_cold_2();
LAB_001b07b0:
    pcStack_f20 = (code *)0x1b07bf;
    run_test_pipe_bind_or_listen_error_after_close_cold_3();
LAB_001b07bf:
    pcStack_f20 = (code *)0x1b07ce;
    run_test_pipe_bind_or_listen_error_after_close_cold_4();
  }
  pcStack_f20 = run_test_pipe_overlong_path;
  run_test_pipe_bind_or_listen_error_after_close_cold_5();
  plVar3 = &lStack_1280;
  pcStack_1288 = (code *)0x1b07ea;
  pcStack_f20 = (code *)__s;
  uVar2 = uv_default_loop();
  pcStack_1288 = (code *)0x1b07f9;
  iVar1 = uv_pipe_init(uVar2,auStack_1208,0);
  alStack_1120[0] = (long)iVar1;
  alStack_1270[0] = 0;
  if (alStack_1120[0] == 0) {
    pcStack_1288 = (code *)0x1b0839;
    memset(alStack_1120,0x40,0x200);
    alStack_1270[0] = -0x24;
    pcStack_1288 = (code *)0x1b0859;
    iVar1 = uv_pipe_bind2(auStack_1208,alStack_1120,0x200,1);
    lStack_1280 = (long)iVar1;
    if (alStack_1270[0] != lStack_1280) goto LAB_001b0a0d;
    lStack_1280 = -0x24;
    pcStack_1288 = (code *)0x1b089f;
    iVar1 = uv_pipe_connect2(alStack_1270,auStack_1208,alStack_1120,0x200,1,abort);
    lStack_1278 = (long)iVar1;
    if (lStack_1280 != lStack_1278) goto LAB_001b0a1a;
    pcStack_1288 = (code *)0x1b08ba;
    uVar2 = uv_default_loop();
    pcStack_1288 = (code *)0x1b08c4;
    iVar1 = uv_run(uVar2,0);
    lStack_1280 = (long)iVar1;
    lStack_1278 = 0;
    if (lStack_1280 != 0) goto LAB_001b0a27;
    lStack_1280 = -0x16;
    pcStack_1288 = (code *)0x1b08fb;
    iVar1 = uv_pipe_bind(auStack_1208,"");
    lStack_1278 = (long)iVar1;
    if (lStack_1280 != lStack_1278) goto LAB_001b0a34;
    pcStack_1288 = (code *)0x1b092e;
    uv_pipe_connect(alStack_1270,auStack_1208,"",connect_overlong_cb);
    pcStack_1288 = (code *)0x1b0933;
    uVar2 = uv_default_loop();
    pcStack_1288 = (code *)0x1b093d;
    iVar1 = uv_run(uVar2,0);
    lStack_1280 = (long)iVar1;
    lStack_1278 = 0;
    if (lStack_1280 != 0) goto LAB_001b0a41;
    lStack_1280 = 1;
    lStack_1278 = (long)connect_cb_called;
    if (lStack_1278 != 1) goto LAB_001b0a4e;
    lStack_1280 = 1;
    lStack_1278 = (long)close_cb_called;
    if (lStack_1278 == 1) {
      pcStack_1288 = (code *)0x1b09a6;
      uVar2 = uv_default_loop();
      pcStack_1288 = (code *)0x1b09ba;
      uv_walk(uVar2,close_walk_cb,0);
      pcStack_1288 = (code *)0x1b09c4;
      uv_run(uVar2,0);
      lStack_1280 = 0;
      pcStack_1288 = (code *)0x1b09d1;
      uVar2 = uv_default_loop();
      pcStack_1288 = (code *)0x1b09d9;
      iVar1 = uv_loop_close(uVar2);
      lStack_1278 = (long)iVar1;
      if (lStack_1280 == lStack_1278) {
        pcStack_1288 = (code *)0x1b09f0;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b0a68;
    }
  }
  else {
    pcStack_1288 = (code *)0x1b0a0d;
    run_test_pipe_overlong_path_cold_1();
LAB_001b0a0d:
    pcStack_1288 = (code *)0x1b0a1a;
    run_test_pipe_overlong_path_cold_2();
LAB_001b0a1a:
    pcStack_1288 = (code *)0x1b0a27;
    run_test_pipe_overlong_path_cold_3();
LAB_001b0a27:
    pcStack_1288 = (code *)0x1b0a34;
    run_test_pipe_overlong_path_cold_4();
LAB_001b0a34:
    pcStack_1288 = (code *)0x1b0a41;
    run_test_pipe_overlong_path_cold_5();
LAB_001b0a41:
    pcStack_1288 = (code *)0x1b0a4e;
    run_test_pipe_overlong_path_cold_6();
LAB_001b0a4e:
    pcStack_1288 = (code *)0x1b0a5b;
    run_test_pipe_overlong_path_cold_7();
  }
  pcStack_1288 = (code *)0x1b0a68;
  run_test_pipe_overlong_path_cold_8();
LAB_001b0a68:
  iVar1 = (int)&lStack_1278;
  pcStack_1288 = connect_overlong_cb;
  run_test_pipe_overlong_path_cold_9();
  pcStack_1288 = (code *)(long)iVar1;
  if (pcStack_1288 == (code *)0xffffffffffffffea) {
    connect_cb_called = connect_cb_called + 1;
    iVar1 = uv_close(*(undefined8 *)((long)plVar3 + 0x50),close_cb);
    return iVar1;
  }
  ppcVar4 = &pcStack_1288;
  connect_overlong_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(ppcVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_bind_error_addrinuse) {
  uv_pipe_t server1, server2;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server1, 0);
  ASSERT_OK(r);
  r = uv_pipe_bind(&server1, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_pipe_init(uv_default_loop(), &server2, 0);
  ASSERT_OK(r);
  r = uv_pipe_bind(&server2, TEST_PIPENAME);
  ASSERT_EQ(r, UV_EADDRINUSE);

  r = uv_listen((uv_stream_t*)&server1, SOMAXCONN, NULL);
  ASSERT_OK(r);
  r = uv_listen((uv_stream_t*)&server2, SOMAXCONN, NULL);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server1, close_cb);
  uv_close((uv_handle_t*)&server2, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}